

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O1

USTATUS decompress(UByteArray *compressedData,UINT8 compressionType,UINT8 *algorithm,
                  UINT32 *dictionarySize,UByteArray *decompressedData,
                  UByteArray *efiDecompressedData)

{
  uint *Source;
  UINT8 UVar1;
  UINTN UVar2;
  void *pvVar3;
  Byte *data;
  UINTN UVar4;
  USTATUS UVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  undefined7 in_register_00000031;
  USTATUS UVar9;
  pointer pcVar10;
  UINT32 UVar11;
  UINT32 decompressedSize;
  UINT32 scratchSize;
  UINT32 state;
  UINT32 local_8c;
  void *local_88;
  string *local_80;
  UINT32 local_74;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  void *local_50;
  ulong local_48;
  ulong local_40;
  UInt32 local_34;
  
  local_8c = 0;
  local_74 = 0;
  *dictionarySize = 0;
  iVar8 = (int)CONCAT71(in_register_00000031,compressionType);
  local_80 = (string *)decompressedData;
  if (1 < iVar8) {
    if (iVar8 == 2) {
      *algorithm = '\0';
      pcVar10 = (compressedData->d)._M_dataplus._M_p;
      UVar11 = (UINT32)(compressedData->d)._M_string_length;
      UVar5 = LzmaGetInfo(pcVar10,UVar11,&local_8c);
      if (UVar5 == 0) {
        UVar1 = '\x05';
      }
      else {
        pcVar10 = pcVar10 + 4;
        UVar5 = LzmaGetInfo(pcVar10,UVar11,&local_8c);
        if (UVar5 != 0) {
          return 0x19;
        }
        UVar1 = '\x06';
      }
      *algorithm = UVar1;
      data = (Byte *)malloc((ulong)local_8c);
      if (data == (Byte *)0x0) {
        return 4;
      }
      UVar5 = LzmaDecompress(pcVar10,UVar11,data);
      if ((UVar5 != 0) || ((long)(int)local_8c < 0)) {
        free(data);
        return 0x19;
      }
      *dictionarySize = *(UINT32 *)(pcVar10 + 1);
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,data,data + (int)local_8c);
      std::__cxx11::string::_M_assign(local_80);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
    }
    else {
      if (iVar8 != 0x86) goto LAB_00149814;
      *algorithm = '\0';
      pcVar10 = (compressedData->d)._M_dataplus._M_p;
      UVar11 = (UINT32)(compressedData->d)._M_string_length;
      UVar5 = LzmaGetInfo(pcVar10,UVar11,&local_8c);
      UVar9 = 0x19;
      if (UVar5 != 0) {
        return 0x19;
      }
      *algorithm = '\a';
      data = (Byte *)malloc((ulong)local_8c);
      if (data == (Byte *)0x0) {
        return 4;
      }
      UVar5 = LzmaDecompress(pcVar10,UVar11,data);
      if ((UVar5 != 0) || ((long)(int)local_8c < 0)) goto LAB_0014992f;
      local_34 = 0;
      z7_BranchConvSt_X86_Dec(data,(long)(int)local_8c,0,&local_34);
      *dictionarySize = *(UINT32 *)(pcVar10 + 1);
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,data,data + (int)local_8c);
      std::__cxx11::string::_M_assign(local_80);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
    }
    free(data);
    return 0;
  }
  if (iVar8 == 0) {
    std::__cxx11::string::_M_assign((string *)decompressedData);
    *algorithm = '\x01';
    return 0;
  }
  if (iVar8 != 1) {
LAB_00149814:
    *algorithm = '\0';
    return 0x1b;
  }
  *algorithm = '\0';
  Source = (uint *)(compressedData->d)._M_dataplus._M_p;
  uVar7 = (compressedData->d)._M_string_length;
  UVar11 = (UINT32)uVar7;
  UVar9 = 0x18;
  if ((ulong)*Source + 8 != (uVar7 & 0xffffffff)) {
    return 0x18;
  }
  UVar2 = EfiTianoGetInfo(Source,UVar11,&local_8c,&local_74);
  if (UVar2 != 0) {
    return 0x18;
  }
  uVar7 = (ulong)local_8c;
  local_88 = malloc(uVar7);
  local_40 = uVar7;
  pvVar3 = malloc(uVar7);
  local_48 = (ulong)local_74;
  data = (Byte *)malloc(local_48);
  local_50 = pvVar3;
  if ((pvVar3 == (void *)0x0 || local_88 == (void *)0x0) || data == (Byte *)0x0) {
    free(local_88);
    free(local_50);
    goto LAB_0014992f;
  }
  UVar2 = TianoDecompress(Source,UVar11,local_88,(UINT32)local_40,data,(UINT32)local_48);
  pvVar3 = local_50;
  UVar4 = EfiDecompress(Source,UVar11,local_50,local_8c,data,local_74);
  lVar6 = (long)(int)local_8c;
  UVar9 = 0x18;
  if (-1 < lVar6) {
    if (UVar4 == 0 && UVar2 == 0) {
      *algorithm = '\x04';
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,local_88,(long)local_88 + lVar6);
      std::__cxx11::string::_M_assign(local_80);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,pvVar3,(long)pvVar3 + (long)(int)local_8c);
      std::__cxx11::string::_M_assign((string *)efiDecompressedData);
      if (local_70[0] != local_60) goto LAB_00149777;
    }
    else {
      if (UVar2 == 0) {
        *algorithm = '\x03';
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_70,local_88,(long)local_88 + lVar6);
        std::__cxx11::string::_M_assign(local_80);
      }
      else {
        if (UVar4 != 0) goto LAB_00149784;
        *algorithm = '\x02';
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_70,pvVar3,(long)pvVar3 + lVar6);
        std::__cxx11::string::_M_assign(local_80);
      }
      if (local_70[0] != local_60) {
LAB_00149777:
        operator_delete(local_70[0]);
      }
    }
    UVar9 = 0;
  }
LAB_00149784:
  free(local_88);
  free(pvVar3);
LAB_0014992f:
  free(data);
  return UVar9;
}

Assistant:

USTATUS decompress(const UByteArray & compressedData, const UINT8 compressionType, UINT8 & algorithm, UINT32 & dictionarySize, UByteArray & decompressedData, UByteArray & efiDecompressedData)
{
    const UINT8* data;
    UINT32 dataSize;
    UINT8* decompressed;
    UINT8* efiDecompressed;
    UINT32 decompressedSize = 0;
    UINT8* scratch;
    UINT32 scratchSize = 0;
    const EFI_TIANO_HEADER* header;
    
    // For all but LZMA dictionary size is 0
    dictionarySize = 0;
    
    switch (compressionType)
    {
        case EFI_NOT_COMPRESSED: {
            decompressedData = compressedData;
            algorithm = COMPRESSION_ALGORITHM_NONE;
            return U_SUCCESS;
        }
        case EFI_STANDARD_COMPRESSION: {
            // Set default algorithm to unknown
            algorithm = COMPRESSION_ALGORITHM_UNKNOWN;
            
            // Get buffer sizes
            data = (UINT8*)compressedData.data();
            dataSize = (UINT32)compressedData.size();
            
            // Check header to be valid
            header = (const EFI_TIANO_HEADER*)data;
            if (header->CompSize + sizeof(EFI_TIANO_HEADER) != dataSize)
                return U_STANDARD_DECOMPRESSION_FAILED;
            
            // Get info function is the same for both algorithms
            if (U_SUCCESS != EfiTianoGetInfo(data, dataSize, &decompressedSize, &scratchSize))
                return U_STANDARD_DECOMPRESSION_FAILED;
            
            // Allocate memory
            decompressed = (UINT8*)malloc(decompressedSize);
            efiDecompressed = (UINT8*)malloc(decompressedSize);
            scratch = (UINT8*)malloc(scratchSize);
            if (!decompressed || !efiDecompressed || !scratch) {
                free(decompressed);
                free(efiDecompressed);
                free(scratch);
                return U_STANDARD_DECOMPRESSION_FAILED;
            }
            
            // Decompress section data using both algorithms
            USTATUS result = U_SUCCESS;
            // Try Tiano
            USTATUS TianoResult = TianoDecompress(data, dataSize, decompressed, decompressedSize, scratch, scratchSize);
            // Try EFI 1.1
            USTATUS EfiResult = EfiDecompress(data, dataSize, efiDecompressed, decompressedSize, scratch, scratchSize);
            
            if (decompressedSize > INT32_MAX) {
                result = U_STANDARD_DECOMPRESSION_FAILED;
            }
            else if (EfiResult == U_SUCCESS && TianoResult == U_SUCCESS) { // Both decompressions are OK
                algorithm = COMPRESSION_ALGORITHM_UNDECIDED;
                decompressedData = UByteArray((const char*)decompressed, (int)decompressedSize);
                efiDecompressedData = UByteArray((const char*)efiDecompressed, (int)decompressedSize);
            }
            else if (TianoResult == U_SUCCESS) { // Only Tiano is OK
                algorithm = COMPRESSION_ALGORITHM_TIANO;
                decompressedData = UByteArray((const char*)decompressed, (int)decompressedSize);
            }
            else if (EfiResult == U_SUCCESS) { // Only EFI 1.1 is OK
                algorithm = COMPRESSION_ALGORITHM_EFI11;
                decompressedData = UByteArray((const char*)efiDecompressed, (int)decompressedSize);
            }
            else { // Both decompressions failed
                result = U_STANDARD_DECOMPRESSION_FAILED;
            }
            
            free(decompressed);
            free(efiDecompressed);
            free(scratch);
            return result;
        }
        case EFI_CUSTOMIZED_COMPRESSION: {
            // Set default algorithm to unknown
            algorithm = COMPRESSION_ALGORITHM_UNKNOWN;
            
            // Get buffer sizes
            data = (const UINT8*)compressedData.constData();
            dataSize = (UINT32)compressedData.size();
            
            // Get info as normal LZMA section
            if (U_SUCCESS != LzmaGetInfo(data, dataSize, &decompressedSize)) {
                // Get info as Intel legacy LZMA section
                data += sizeof(UINT32);
                if (U_SUCCESS != LzmaGetInfo(data, dataSize, &decompressedSize)) {
                    return U_CUSTOMIZED_DECOMPRESSION_FAILED;
                }
                else {
                    algorithm = COMPRESSION_ALGORITHM_LZMA_INTEL_LEGACY;
                }
            }
            else {
                algorithm = COMPRESSION_ALGORITHM_LZMA;
            }
            
            // Allocate memory
            decompressed = (UINT8*)malloc(decompressedSize);
            if (!decompressed) {
                return U_OUT_OF_MEMORY;
            }
            
            // Decompress section data
            if (U_SUCCESS != LzmaDecompress(data, dataSize, decompressed)) {
                free(decompressed);
                return U_CUSTOMIZED_DECOMPRESSION_FAILED;
            }
            
            if (decompressedSize > INT32_MAX) {
                free(decompressed);
                return U_CUSTOMIZED_DECOMPRESSION_FAILED;
            }
            
            dictionarySize = readUnaligned((UINT32*)(data + 1)); // LZMA dictionary size is stored in bytes 1-4 of LZMA properties header
            decompressedData = UByteArray((const char*)decompressed, (int)decompressedSize);
            free(decompressed);
            return U_SUCCESS;
        }
        case EFI_CUSTOMIZED_COMPRESSION_LZMAF86: {
            // Set default algorithm to unknown
            algorithm = COMPRESSION_ALGORITHM_UNKNOWN;
            
            // Get buffer sizes
            data = (const UINT8*)compressedData.constData();
            dataSize = (UINT32)compressedData.size();
            
            // Get info as normal LZMA section
            if (U_SUCCESS != LzmaGetInfo(data, dataSize, &decompressedSize)) {
                return U_CUSTOMIZED_DECOMPRESSION_FAILED;
            }
            algorithm = COMPRESSION_ALGORITHM_LZMAF86;
            
            // Allocate memory
            decompressed = (UINT8*)malloc(decompressedSize);
            if (!decompressed) {
                return U_OUT_OF_MEMORY;
            }
            
            // Decompress section data
            if (U_SUCCESS != LzmaDecompress(data, dataSize, decompressed)) {
                free(decompressed);
                return U_CUSTOMIZED_DECOMPRESSION_FAILED;
            }
            
            if (decompressedSize > INT32_MAX) {
                free(decompressed);
                return U_CUSTOMIZED_DECOMPRESSION_FAILED;
            }
            
            // TODO: need to correctly handle non-x86 architecture of the FW image
            // After LZMA decompression, the data need to be converted to the raw data.
            UINT32 state = 0;
            z7_BranchConvSt_X86_Dec(decompressed, decompressedSize, 0, &state);
            
            dictionarySize = readUnaligned((UINT32*)(data + 1)); // LZMA dictionary size is stored in bytes 1-4 of LZMA properties header
            decompressedData = UByteArray((const char*)decompressed, (int)decompressedSize);
            free(decompressed);
            return U_SUCCESS;
        }
        default: {
            algorithm = COMPRESSION_ALGORITHM_UNKNOWN;
            return U_UNKNOWN_COMPRESSION_TYPE;
        }
    }
}